

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int inputPush(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  xmlParserInputPtr *ppxVar1;
  int iVar2;
  
  iVar2 = -1;
  if (value != (xmlParserInputPtr)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    iVar2 = ctxt->inputMax;
    if (iVar2 <= ctxt->inputNr) {
      ctxt->inputMax = iVar2 * 2;
      ppxVar1 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(long)iVar2 << 4);
      ctxt->inputTab = ppxVar1;
      if (ppxVar1 == (xmlParserInputPtr *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        ctxt->inputMax = ctxt->inputMax / 2;
        return -1;
      }
    }
    iVar2 = ctxt->inputNr;
    ctxt->inputTab[iVar2] = value;
    ctxt->input = value;
    ctxt->inputNr = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int
inputPush(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    if ((ctxt == NULL) || (value == NULL))
        return(-1);
    if (ctxt->inputNr >= ctxt->inputMax) {
        ctxt->inputMax *= 2;
        ctxt->inputTab =
            (xmlParserInputPtr *) xmlRealloc(ctxt->inputTab,
                                             ctxt->inputMax *
                                             sizeof(ctxt->inputTab[0]));
        if (ctxt->inputTab == NULL) {
            xmlErrMemory(ctxt, NULL);
	    ctxt->inputMax /= 2;
            return (-1);
        }
    }
    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;
    return (ctxt->inputNr++);
}